

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aead_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d4e6f::PerAEADTest_TruncatedTags_Test::TestBody
          (PerAEADTest_TruncatedTags_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  EVP_AEAD *pEVar3;
  char *pcVar4;
  size_t tag_len_00;
  evp_aead_ctx_st *peVar5;
  Message *pMVar6;
  size_t sVar7;
  size_t sVar8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var9;
  AssertHelper local_5c0;
  Message local_5b8;
  Bytes local_5b0;
  Span<const_unsigned_char> local_5a0;
  Bytes local_590;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_5;
  Message local_568;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_4;
  size_t i_1;
  AssertHelper local_528;
  Message local_520;
  int local_514;
  undefined1 local_510 [8];
  AssertionResult gtest_ar__2;
  size_t plaintext2_len;
  uint8_t plaintext2 [17];
  AssertHelper local_4d8;
  Message local_4d0;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_3;
  size_t expected_overhead;
  size_t overhead_used;
  Message local_4a0;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_2;
  size_t i;
  AssertHelper local_460;
  Message local_458;
  int local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_430;
  uint8_t kSentinel;
  size_t ciphertext_len;
  uint8_t ciphertext [128];
  uchar local_399 [1];
  undefined1 local_398 [7];
  uint8_t plaintext [1];
  AssertHelper local_378;
  Message local_370;
  int local_364;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_;
  ScopedEVP_AEAD_CTX ctx;
  size_t tag_len;
  Message local_100;
  unsigned_long local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  size_t nonce_len;
  uint8_t nonce [32];
  AssertHelper local_a8 [3];
  Message local_90;
  unsigned_long local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  size_t key_len;
  uint8_t key [80];
  PerAEADTest_TruncatedTags_Test *this_local;
  
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  if ((pPVar2->flags & 2) != 0) {
    ::OPENSSL_memset(&key_len,0,0x50);
    pEVar3 = PerAEADTest::aead(&this->super_PerAEADTest);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )EVP_AEAD_key_length(pEVar3);
    local_88 = 0x50;
    testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
              ((internal *)local_80,"sizeof(key)","key_len",&local_88,
               (unsigned_long *)&gtest_ar.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
      testing::internal::AssertHelper::AssertHelper
                (local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                 ,0x1e3,pcVar4);
      testing::internal::AssertHelper::operator=(local_a8,&local_90);
      testing::internal::AssertHelper::~AssertHelper(local_a8);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    if (bVar1) {
      ::OPENSSL_memset(&nonce_len,0,0x20);
      pEVar3 = PerAEADTest::aead(&this->super_PerAEADTest);
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )EVP_AEAD_nonce_length(pEVar3);
      local_f8 = 0x20;
      testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
                ((internal *)local_f0,"sizeof(nonce)","nonce_len",&local_f8,
                 (unsigned_long *)&gtest_ar_1.message_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&tag_len,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                   ,0x1e8,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&tag_len,&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tag_len);
        testing::Message::~Message(&local_100);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      if (bVar1) {
        pPVar2 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
        tag_len_00 = MinimumTagLength(pPVar2->flags);
        bssl::internal::
        StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::
        StackAllocated((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                        *)&gtest_ar_.message_);
        peVar5 = bssl::internal::
                 StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::
                 get((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                      *)&gtest_ar_.message_);
        pEVar3 = PerAEADTest::aead(&this->super_PerAEADTest);
        pcVar4 = (char *)0x0;
        local_364 = EVP_AEAD_CTX_init(peVar5,pEVar3,(uint8_t *)&key_len,
                                      (size_t)gtest_ar.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl,tag_len_00,(ENGINE *)0x0);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_360,&local_364,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
        if (!bVar1) {
          testing::Message::Message(&local_370);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_398,(internal *)local_360,
                     (AssertionResult *)
                     "EVP_AEAD_CTX_init(ctx.get(), aead(), key, key_len, tag_len, __null )","false",
                     "true",pcVar4);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_378,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x1ed,pcVar4);
          testing::internal::AssertHelper::operator=(&local_378,&local_370);
          testing::internal::AssertHelper::~AssertHelper(&local_378);
          std::__cxx11::string::~string((string *)local_398);
          testing::Message::~Message(&local_370);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
        if (bVar1) {
          local_399[0] = 'A';
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._7_1_ = 0x2a;
          ::OPENSSL_memset(&ciphertext_len,0x2a,0x80);
          peVar5 = bssl::internal::
                   StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                   ::get((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                          *)&gtest_ar_.message_);
          _Var9._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               gtest_ar_1.message_;
          local_44c = EVP_AEAD_CTX_seal(peVar5,(uint8_t *)&ciphertext_len,
                                        (size_t *)&stack0xfffffffffffffbd0,0x80,
                                        (uint8_t *)&nonce_len,
                                        (size_t)gtest_ar_1.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl,local_399,1,(uint8_t *)0x0,0);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_448,&local_44c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
          if (!bVar1) {
            testing::Message::Message(&local_458);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&i,(internal *)local_448,
                       (AssertionResult *)
                       "EVP_AEAD_CTX_seal(ctx.get(), ciphertext, &ciphertext_len, sizeof(ciphertext), nonce, nonce_len, plaintext, sizeof(plaintext), nullptr , 0)"
                       ,"false","true",(char *)_Var9._M_head_impl);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_460,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                       ,0x1f8,pcVar4);
            testing::internal::AssertHelper::operator=(&local_460,&local_458);
            testing::internal::AssertHelper::~AssertHelper(&local_460);
            std::__cxx11::string::~string((string *)&i);
            testing::Message::~Message(&local_458);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
          if (bVar1) {
            for (gtest_ar_2.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl =
                      (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                       )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                         )_Stack_430._M_head_impl;
                (ulong)gtest_ar_2.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl < 0x80;
                gtest_ar_2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )((long)gtest_ar_2.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 1)) {
              testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
                        ((EqHelper *)local_498,"kSentinel","ciphertext[i]",
                         (uchar *)((long)&gtest_ar__1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  + 7),
                         ciphertext +
                         (long)gtest_ar_2.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + -8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
              if (!bVar1) {
                testing::Message::Message(&local_4a0);
                pMVar6 = testing::Message::operator<<
                                   (&local_4a0,
                                    (char (*) [41])"Sealing wrote off the end of the buffer.");
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&overhead_used,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                           ,0x1fc,pcVar4);
                testing::internal::AssertHelper::operator=((AssertHelper *)&overhead_used,pMVar6);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&overhead_used);
                testing::Message::~Message(&local_4a0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
            }
            expected_overhead = (long)_Stack_430._M_head_impl - 1;
            pEVar3 = PerAEADTest::aead(&this->super_PerAEADTest);
            sVar7 = EVP_AEAD_max_overhead(pEVar3);
            pEVar3 = PerAEADTest::aead(&this->super_PerAEADTest);
            sVar8 = EVP_AEAD_max_tag_len(pEVar3);
            gtest_ar_3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )((tag_len_00 + sVar7) - sVar8);
            testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                      ((EqHelper *)local_4c8,"overhead_used","expected_overhead",&expected_overhead,
                       (unsigned_long *)&gtest_ar_3.message_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
            if (!bVar1) {
              testing::Message::Message(&local_4d0);
              pMVar6 = testing::Message::operator<<
                                 (&local_4d0,
                                  (char (*) [52])
                                  "AEAD is probably ignoring request to truncate tags.");
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
              testing::internal::AssertHelper::AssertHelper
                        (&local_4d8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                         ,0x203,pcVar4);
              testing::internal::AssertHelper::operator=(&local_4d8,pMVar6);
              testing::internal::AssertHelper::~AssertHelper(&local_4d8);
              testing::Message::~Message(&local_4d0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
            ::OPENSSL_memset(&plaintext2_len,0x2a,0x11);
            peVar5 = bssl::internal::
                     StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                     ::get((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                            *)&gtest_ar_.message_);
            _Var9._M_head_impl =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_1.message_;
            local_514 = EVP_AEAD_CTX_open(peVar5,(uint8_t *)&plaintext2_len,
                                          (size_t *)&gtest_ar__2.message_,0x11,(uint8_t *)&nonce_len
                                          ,(size_t)gtest_ar_1.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(uint8_t *)&ciphertext_len,
                                          (size_t)_Stack_430._M_head_impl,(uint8_t *)0x0,0);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_510,&local_514,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
            if (!bVar1) {
              testing::Message::Message(&local_520);
              pMVar6 = testing::Message::operator<<
                                 (&local_520,
                                  (char (*) [40])"Opening with truncated tag didn\'t work.");
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&i_1,(internal *)local_510,
                         (AssertionResult *)
                         "EVP_AEAD_CTX_open( ctx.get(), plaintext2, &plaintext2_len, sizeof(plaintext2), nonce, nonce_len, ciphertext, ciphertext_len, nullptr , 0)"
                         ,"false","true",(char *)_Var9._M_head_impl);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_528,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                         ,0x20c,pcVar4);
              testing::internal::AssertHelper::operator=(&local_528,pMVar6);
              testing::internal::AssertHelper::~AssertHelper(&local_528);
              std::__cxx11::string::~string((string *)&i_1);
              testing::Message::~Message(&local_520);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
            if (bVar1) {
              for (gtest_ar_4.message_ = gtest_ar__2.message_;
                  (ulong)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl < 0x11;
                  gtest_ar_4.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )((long)gtest_ar_4.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 1)) {
                testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
                          ((EqHelper *)local_560,"kSentinel","plaintext2[i]",
                           (uchar *)((long)&gtest_ar__1.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    + 7),
                           plaintext2 +
                           (long)gtest_ar_4.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + -8);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_560);
                if (!bVar1) {
                  testing::Message::Message(&local_568);
                  pMVar6 = testing::Message::operator<<
                                     (&local_568,
                                      (char (*) [41])"Opening wrote off the end of the buffer.");
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                             ,0x211,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_5.message_,pMVar6);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_5.message_);
                  testing::Message::~Message(&local_568);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
              }
              bssl::Span<unsigned_char_const>::Span<1ul>
                        ((Span<unsigned_char_const> *)&local_5a0,&local_399);
              Bytes::Bytes(&local_590,local_5a0);
              Bytes::Bytes(&local_5b0,(uint8_t *)&plaintext2_len,
                           (size_t)gtest_ar__2.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
              testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                        ((EqHelper *)local_580,"Bytes(plaintext)",
                         "Bytes(plaintext2, plaintext2_len)",&local_590,&local_5b0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
              if (!bVar1) {
                testing::Message::Message(&local_5b8);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
                testing::internal::AssertHelper::AssertHelper
                          (&local_5c0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                           ,0x215,pcVar4);
                testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
                testing::internal::AssertHelper::~AssertHelper(&local_5c0);
                testing::Message::~Message(&local_5b8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
            }
          }
        }
        bssl::internal::
        StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::
        ~StackAllocated((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                         *)&gtest_ar_.message_);
      }
    }
  }
  return;
}

Assistant:

TEST_P(PerAEADTest, TruncatedTags) {
  if (!(GetParam().flags & kCanTruncateTags)) {
    return;
  }

  uint8_t key[EVP_AEAD_MAX_KEY_LENGTH];
  OPENSSL_memset(key, 0, sizeof(key));
  const size_t key_len = EVP_AEAD_key_length(aead());
  ASSERT_GE(sizeof(key), key_len);

  uint8_t nonce[EVP_AEAD_MAX_NONCE_LENGTH];
  OPENSSL_memset(nonce, 0, sizeof(nonce));
  const size_t nonce_len = EVP_AEAD_nonce_length(aead());
  ASSERT_GE(sizeof(nonce), nonce_len);

  const size_t tag_len = MinimumTagLength(GetParam().flags);
  bssl::ScopedEVP_AEAD_CTX ctx;
  ASSERT_TRUE(EVP_AEAD_CTX_init(ctx.get(), aead(), key, key_len, tag_len,
                                NULL /* ENGINE */));

  const uint8_t plaintext[1] = {'A'};

  uint8_t ciphertext[128];
  size_t ciphertext_len;
  constexpr uint8_t kSentinel = 42;
  OPENSSL_memset(ciphertext, kSentinel, sizeof(ciphertext));

  ASSERT_TRUE(EVP_AEAD_CTX_seal(ctx.get(), ciphertext, &ciphertext_len,
                                sizeof(ciphertext), nonce, nonce_len, plaintext,
                                sizeof(plaintext), nullptr /* ad */, 0));

  for (size_t i = ciphertext_len; i < sizeof(ciphertext); i++) {
    // Sealing must not write past where it said it did.
    EXPECT_EQ(kSentinel, ciphertext[i])
        << "Sealing wrote off the end of the buffer.";
  }

  const size_t overhead_used = ciphertext_len - sizeof(plaintext);
  const size_t expected_overhead =
      tag_len + EVP_AEAD_max_overhead(aead()) - EVP_AEAD_max_tag_len(aead());
  EXPECT_EQ(overhead_used, expected_overhead)
      << "AEAD is probably ignoring request to truncate tags.";

  uint8_t plaintext2[sizeof(plaintext) + 16];
  OPENSSL_memset(plaintext2, kSentinel, sizeof(plaintext2));

  size_t plaintext2_len;
  ASSERT_TRUE(EVP_AEAD_CTX_open(
      ctx.get(), plaintext2, &plaintext2_len, sizeof(plaintext2), nonce,
      nonce_len, ciphertext, ciphertext_len, nullptr /* ad */, 0))
      << "Opening with truncated tag didn't work.";

  for (size_t i = plaintext2_len; i < sizeof(plaintext2); i++) {
    // Likewise, opening should also stay within bounds.
    EXPECT_EQ(kSentinel, plaintext2[i])
        << "Opening wrote off the end of the buffer.";
  }

  EXPECT_EQ(Bytes(plaintext), Bytes(plaintext2, plaintext2_len));
}